

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

bool __thiscall
btConvexHullInternal::shiftFace
          (btConvexHullInternal *this,Face *face,btScalar amount,
          btAlignedObjectArray<btConvexHullInternal::Vertex_*> *stack)

{
  float fVar1;
  Edge *pEVar2;
  Vertex *src;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  int64_t b;
  Face *pFVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  Edge *pEVar14;
  Edge *pEVar15;
  Edge *pEVar16;
  Edge *pEVar17;
  Vertex **ppVVar18;
  long lVar19;
  long lVar20;
  Edge *pEVar21;
  Rational128 *_Val;
  long lVar22;
  long lVar23;
  long a;
  long lVar24;
  Edge *e;
  btScalar bVar25;
  undefined4 in_XMM0_Db;
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  btVector3 bVar30;
  Point32 PVar31;
  Int128 IVar32;
  Int128 IVar33;
  Int128 IVar34;
  Int128 IVar35;
  Vertex *v;
  Rational128 dot;
  Point32 shiftedOrigin;
  btVector3 origShift;
  Int128 det;
  Point64 n1;
  Point64 normal;
  Vertex *removed;
  Rational128 optDot;
  int local_274;
  Edge *local_268;
  Vertex *local_258;
  Rational128 local_250;
  undefined8 local_228;
  Edge *local_210;
  long local_208;
  long local_200;
  uint64_t local_1f8;
  uint64_t local_1f0;
  uint64_t local_1e8;
  Edge *local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  Face *local_1c0;
  Int128 local_1b8;
  int local_1a4;
  Point32 local_1a0;
  undefined1 local_190 [8];
  float fStack_188;
  undefined4 uStack_184;
  Edge *local_180;
  Int128 local_178;
  Point64 local_168;
  Int128 local_150;
  Point64 local_140;
  Pool<btConvexHullInternal::Vertex> *local_128;
  Point32 *local_120;
  Edge *local_118;
  Vertex *local_110;
  Point32 local_108;
  Rational128 local_f8;
  Int128 local_d0;
  Int128 local_c0;
  Int128 local_b0;
  Int128 local_a0;
  Int128 local_90;
  Int128 local_80;
  Int128 local_70;
  Int128 local_60;
  Int128 local_50;
  Int128 local_40;
  
  local_228 = CONCAT44(in_XMM0_Db,amount);
  bVar30 = getBtNormal(this,face);
  fVar29 = (float)((uint)local_228 ^ (uint)DAT_001af270);
  fVar27 = fVar29 * bVar30.m_floats[0];
  fVar28 = fVar29 * bVar30.m_floats[1];
  fVar29 = fVar29 * bVar30.m_floats[2];
  auVar3._4_4_ = fVar28;
  auVar3._0_4_ = fVar27;
  auVar3._8_4_ = fVar29;
  uStack_184 = 0;
  _local_190 = auVar3;
  fVar1 = (this->scaling).m_floats[0];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    stack0xfffffffffffffe74 = auVar3._4_8_;
    local_190._0_4_ = fVar27 / fVar1;
    uStack_184 = 0;
  }
  fVar1 = (this->scaling).m_floats[1];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    local_190._4_4_ = fVar28 / fVar1;
  }
  fVar1 = (this->scaling).m_floats[2];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fStack_188 = fVar29 / fVar1;
  }
  local_108.z = (int32_t)*(float *)(local_190 + (long)this->minAxis * 4);
  local_108.x = (int)*(float *)(local_190 + (long)this->medAxis * 4);
  local_108.y = (int)*(float *)(local_190 + (long)this->maxAxis * 4);
  local_108.index = -1;
  auVar26._0_4_ = -(uint)(local_108.x == 0);
  auVar26._4_4_ = -(uint)(local_108.x == 0);
  auVar26._8_4_ = -(uint)(local_108.y == 0);
  auVar26._12_4_ = -(uint)(local_108.y == 0);
  uVar10 = movmskpd(this->medAxis,auVar26);
  if ((((uVar10 & 1) != 0) && ((byte)((byte)uVar10 >> 1) != 0)) && (local_108.z == 0)) {
    return true;
  }
  Face::getNormal(&local_140,face);
  lVar13 = (face->origin).x * local_140.x;
  lVar19 = (face->origin).y * local_140.y;
  lVar24 = (face->origin).z * local_140.z;
  local_1a0 = Point32::operator+(&face->origin,&local_108);
  lVar20 = local_1a0.z * local_140.z +
           (local_1a0._0_8_ >> 0x20) * local_140.y + local_1a0.x * local_140.x;
  if (lVar20 < lVar24 + lVar19 + lVar13) {
    pEVar15 = face->nearbyVertex->edges;
    local_1c0 = face;
    local_120 = &face->origin;
    Vertex::dot(&local_f8,face->nearbyVertex,&local_140);
    local_228 = lVar20;
    local_274 = Rational128::compare(&local_f8,lVar20);
    if (local_274 < 0) {
      pEVar21 = pEVar15;
      do {
        Vertex::dot(&local_250,pEVar21->target,&local_140);
        iVar12 = Rational128::compare(&local_250,&local_f8);
        if (0 < iVar12) {
          local_274 = Rational128::compare(&local_250,local_228);
          if (-1 < local_274) goto LAB_00128bcf;
          local_f8.numerator.low = local_250.numerator.low;
          local_f8.numerator.high = local_250.numerator.high;
          pEVar15 = pEVar21->reverse;
          pEVar21 = pEVar15;
        }
        pEVar21 = pEVar21->prev;
        if (pEVar21 == pEVar15) {
          return true;
        }
      } while( true );
    }
    pEVar21 = pEVar15;
    do {
      Vertex::dot(&local_250,pEVar21->target,&local_140);
      iVar11 = Rational128::compare(&local_250,&local_f8);
      iVar12 = local_274;
      if (iVar11 < 0) {
        iVar12 = Rational128::compare(&local_250,local_228);
        local_f8.numerator.low = local_250.numerator.low;
        local_f8.numerator.high = local_250.numerator.high;
        pEVar15 = pEVar21->reverse;
        pEVar21 = pEVar15;
        if (iVar12 < 0) {
          if (pEVar15 == (Edge *)0x0) {
            return false;
          }
LAB_00128bcf:
          if (local_274 == 0) {
            pEVar15 = pEVar21->reverse->next;
            while( true ) {
              Vertex::dot(&local_250,pEVar15->target,&local_140);
              iVar12 = Rational128::compare(&local_250,local_228);
              if (0 < iVar12) break;
              pEVar15 = pEVar15->next;
              if (pEVar15 == pEVar21->reverse) {
                return true;
              }
            }
          }
          local_128 = &this->vertexPool;
          local_210 = (Edge *)0x0;
          pEVar15 = (Edge *)0x0;
          local_180 = (Edge *)0x0;
          do {
            local_268 = pEVar21;
            local_1e0 = pEVar15;
            if (local_274 == 0) {
              pEVar15 = pEVar21->reverse->next;
              pEVar14 = pEVar15;
              while( true ) {
                Vertex::dot(&local_250,pEVar14->target,&local_140);
                iVar12 = Rational128::compare(&local_250,local_228);
                local_268 = pEVar21;
                if (-1 < iVar12) break;
                pEVar21 = pEVar14->reverse;
                pEVar14 = pEVar14->next;
                if (pEVar14 == pEVar15) {
                  return true;
                }
              }
            }
            pEVar21 = local_1e0;
            pEVar15 = local_210;
            b = local_228;
            pEVar14 = local_268;
            if ((local_180 != (Edge *)0x0) && (pEVar14 = local_180, local_268 == local_180)) {
              if (local_274 < 1) {
                if (local_210 != local_1e0->reverse) {
                  btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                            (stack,&local_1e0->target);
                  while (pEVar14 = pEVar15->next, pEVar14 != pEVar21->reverse) {
                    local_250.numerator.low = (uint64_t)pEVar14->target;
                    removeEdgePair(this,pEVar14);
                    btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                              (stack,(Vertex **)&local_250);
                  }
                  local_250.numerator.low = 0;
                  btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                            (stack,(Vertex **)&local_250);
                }
              }
              else {
                local_210->reverse->target = local_1e0->target;
                pEVar15 = local_180->reverse;
                pEVar15->next = local_210;
                local_210->prev = pEVar15;
                pEVar15 = local_1e0->reverse;
                local_210->next = pEVar15;
                pEVar15->prev = local_210;
              }
              this->vertexList = *stack->m_data;
              lVar13 = 0;
              while( true ) {
                local_228 = CONCAT44(local_228._4_4_,stack->m_size);
                if (stack->m_size <= (int)lVar13) break;
                while( true ) {
                  iVar12 = (int)lVar13;
                  if ((int)(uint)local_228 <= iVar12) break;
                  ppVVar18 = stack->m_data;
                  local_250.numerator.low = (uint64_t)ppVVar18[iVar12];
                  lVar13 = (long)iVar12 + 1;
                  bVar8 = false;
                  while( true ) {
                    src = ppVVar18[lVar13];
                    lVar13 = lVar13 + 1;
                    if (src == (Vertex *)0x0) break;
                    Vertex::receiveNearbyFaces((Vertex *)local_250.numerator.low,src);
                    while (pEVar15 = src->edges, pEVar15 != (Edge *)0x0) {
                      if (!bVar8) {
                        btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                                  (stack,(Vertex **)&local_250);
                        pEVar15 = src->edges;
                        bVar8 = true;
                      }
                      btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                                (stack,&pEVar15->target);
                      removeEdgePair(this,src->edges);
                    }
                    ppVVar18 = stack->m_data;
                  }
                  if (bVar8) {
                    local_168.x = 0;
                    btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                              (stack,(Vertex **)&local_168);
                  }
                }
              }
              local_250.numerator.low = 0;
              btAlignedObjectArray<btConvexHullInternal::Vertex_*>::resize
                        (stack,0,(Vertex **)&local_250);
              local_120->x = local_1a0.x;
              local_120->y = local_1a0.y;
              local_120->z = local_1a0.z;
              local_120->index = local_1a0.index;
              return true;
            }
            pEVar21 = local_268->reverse;
            local_180 = pEVar14;
            do {
              pEVar21 = pEVar21->reverse->prev;
              Vertex::dot(&local_250,pEVar21->target,&local_140);
              iVar12 = Rational128::compare(&local_250,b);
            } while (iVar12 < 0);
            if (iVar12 != 0) {
              local_110 = pEVar21->target;
              local_118 = pEVar21->reverse;
              pEVar15 = local_118->prev;
              if (pEVar15 == local_118) {
                pEVar15 = (Edge *)0x0;
              }
              else {
                pEVar14 = local_118->next;
                pEVar15->next = pEVar14;
                pEVar14->prev = pEVar15;
                local_118->next = local_118;
                local_118->prev = local_118;
              }
              local_110->edges = pEVar15;
              local_1a4 = iVar12;
              Face::getNormal((Point64 *)&local_250,pEVar21->face);
              Face::getNormal(&local_168,pEVar21->reverse->face);
              lVar13 = (long)(local_1c0->dir0).x;
              lVar19 = (long)(local_1c0->dir0).y;
              lVar24 = (long)(local_1c0->dir0).z;
              local_200 = local_250.denominator.low * lVar24 +
                          local_250.numerator.high * lVar19 + local_250.numerator.low * lVar13;
              lVar22 = (long)(local_1c0->dir1).x;
              lVar23 = (long)(local_1c0->dir1).y;
              lVar20 = (long)(local_1c0->dir1).z;
              a = local_250.denominator.low * lVar20 +
                  local_250.numerator.high * lVar23 + local_250.numerator.low * lVar22;
              lVar13 = lVar24 * local_168.z + lVar19 * local_168.y + lVar13 * local_168.x;
              lVar19 = local_168.z * lVar20 + local_168.y * lVar23 + local_168.x * lVar22;
              local_1d0 = lVar13;
              local_1c8 = lVar19;
              PVar31 = Point32::operator-(&pEVar21->face->origin,&local_1a0);
              local_208 = (long)PVar31.z * local_250.denominator.low +
                          (long)PVar31.x * local_250.numerator.low +
                          (PVar31._0_8_ >> 0x20) * local_250.numerator.high;
              PVar31 = Point32::operator-(&pEVar21->reverse->face->origin,&local_1a0);
              local_1d8 = PVar31.z * local_168.z +
                          PVar31.x * local_168.x + (PVar31._0_8_ >> 0x20) * local_168.y;
              local_1b8 = Int128::mul(local_200,lVar19);
              local_150 = Int128::mul(a,lVar13);
              local_178 = Int128::operator-(&local_1b8,&local_150);
              local_258 = Pool<btConvexHullInternal::Vertex>::newObject(local_128);
              pFVar9 = local_1c0;
              *(undefined8 *)&(local_258->point).index = 0xffffffffffffffff;
              local_150 = Int128::mul((local_1c0->dir0).x * local_208,local_1c8);
              lVar13 = local_1d8;
              local_40 = Int128::mul((pFVar9->dir0).x * local_1d8,a);
              IVar32 = Int128::operator-(&local_150,&local_40);
              local_1e8 = IVar32.high;
              local_1b8 = Int128::mul((pFVar9->dir1).x * lVar13,local_200);
              auVar4._8_8_ = local_1e8;
              auVar4._0_8_ = IVar32.low;
              local_1b8 = (Int128)((undefined1  [16])local_1b8 + auVar4);
              local_50 = Int128::mul((pFVar9->dir1).x * local_208,local_1d0);
              IVar32 = Int128::operator-(&local_1b8,&local_50);
              local_1f0 = IVar32.high;
              IVar33 = Int128::operator*(&local_178,(long)local_1a0.x);
              lVar13 = local_208;
              auVar5._8_8_ = local_1f0;
              auVar5._0_8_ = IVar32.low;
              local_1e8 = SUB168((undefined1  [16])IVar33 + auVar5,0);
              local_1f0 = SUB168((undefined1  [16])IVar33 + auVar5,8);
              local_70 = Int128::mul((pFVar9->dir0).y * local_208,local_1c8);
              lVar19 = local_1d8;
              local_80 = Int128::mul((pFVar9->dir0).y * local_1d8,a);
              IVar32 = Int128::operator-(&local_70,&local_80);
              local_1f8 = IVar32.high;
              IVar33 = Int128::mul((pFVar9->dir1).y * lVar19,local_200);
              auVar6._8_8_ = local_1f8;
              auVar6._0_8_ = IVar32.low;
              local_60 = (Int128)((undefined1  [16])IVar33 + auVar6);
              local_90 = Int128::mul((pFVar9->dir1).y * lVar13,local_1d0);
              IVar32 = Int128::operator-(&local_60,&local_90);
              IVar33 = Int128::operator*(&local_178,(long)local_1a0.y);
              local_1f8 = SUB168((undefined1  [16])IVar32 + (undefined1  [16])IVar33,0);
              local_b0 = Int128::mul((pFVar9->dir0).z * lVar13,local_1c8);
              lVar13 = local_1d8;
              local_c0 = Int128::mul((pFVar9->dir0).z * local_1d8,a);
              IVar34 = Int128::operator-(&local_b0,&local_c0);
              IVar35 = Int128::mul((pFVar9->dir1).z * lVar13,local_200);
              local_a0 = (Int128)((undefined1  [16])IVar34 + (undefined1  [16])IVar35);
              local_d0 = Int128::mul((pFVar9->dir1).z * local_208,local_1d0);
              IVar34 = Int128::operator-(&local_a0,&local_d0);
              IVar35 = Int128::operator*(&local_178,(long)local_1a0.z);
              (local_258->point128).x.low = local_1e8;
              (local_258->point128).x.high = local_1f0;
              (local_258->point128).y.low = local_1f8;
              (local_258->point128).y.high =
                   SUB168((undefined1  [16])IVar32 + (undefined1  [16])IVar33,8);
              (local_258->point128).z =
                   (Int128)((undefined1  [16])IVar34 + (undefined1  [16])IVar35);
              (local_258->point128).denominator.low = local_178.low;
              (local_258->point128).denominator.high = local_178.high;
              bVar25 = PointR128::xvalue(&local_258->point128);
              (local_258->point).x = (int)bVar25;
              bVar25 = PointR128::yvalue(&local_258->point128);
              (local_258->point).y = (int)bVar25;
              bVar25 = PointR128::zvalue(&local_258->point128);
              (local_258->point).z = (int)bVar25;
              pEVar21->target = local_258;
              local_258->edges = local_118;
              btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back(stack,&local_258);
              btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back(stack,&local_110);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = local_1b8.high;
              local_1b8 = (Int128)(auVar7 << 0x40);
              btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                        (stack,(Vertex **)&local_1b8);
              iVar12 = local_1a4;
            }
            pEVar14 = local_1e0;
            if ((iVar12 != 0 || local_274 != 0) ||
               (pEVar15 = local_268->reverse->next, pEVar15->target != pEVar21->target)) {
              pEVar15 = newEdgePair(this,local_268->target,pEVar21->target);
              if (local_274 == 0) {
                pEVar16 = local_268->reverse;
                pEVar17 = pEVar16->next;
                pEVar15->next = pEVar17;
                pEVar17->prev = pEVar15;
LAB_0012935d:
                pEVar16->next = pEVar15;
                pEVar15->prev = pEVar16;
              }
              else if (pEVar14 != (Edge *)0x0) {
                pEVar16 = local_268->reverse;
                goto LAB_0012935d;
              }
              if (iVar12 == 0) {
                pEVar17 = pEVar21->reverse;
                pEVar2 = pEVar17->prev;
                pEVar16 = pEVar15->reverse;
                pEVar2->next = pEVar16;
                pEVar16->prev = pEVar2;
              }
              else {
                pEVar16 = pEVar15->reverse;
                pEVar17 = pEVar21->reverse;
              }
              pEVar16->next = pEVar17;
              pEVar17->prev = pEVar16;
            }
            if (pEVar14 != (Edge *)0x0) {
              pEVar16 = pEVar14->reverse;
              if (local_274 < 1) {
                if (pEVar15 != pEVar16) {
                  _Val = (Rational128 *)&pEVar14->target;
                  while( true ) {
                    btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                              (stack,(Vertex **)_Val);
                    if (pEVar15->next == pEVar14->reverse) break;
                    local_250.numerator.low = (uint64_t)pEVar15->next->target;
                    removeEdgePair(this,pEVar15->next);
                    _Val = &local_250;
                  }
                  local_250.numerator.low = 0;
                  btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                            (stack,(Vertex **)&local_250);
                }
              }
              else {
                pEVar15->next = pEVar16;
                pEVar16->prev = pEVar15;
              }
            }
            pEVar15->face = local_1c0;
            pEVar15->reverse->face = pEVar21->face;
            local_274 = iVar12;
            if (local_210 == (Edge *)0x0) {
              local_210 = pEVar15;
            }
          } while( true );
        }
      }
      local_274 = iVar12;
      pEVar21 = pEVar21->prev;
    } while (pEVar21 != pEVar15);
  }
  return false;
}

Assistant:

bool btConvexHullInternal::shiftFace(Face* face, btScalar amount, btAlignedObjectArray<Vertex*> stack)
{
	btVector3 origShift = getBtNormal(face) * -amount;
	if (scaling[0] != 0)
	{
		origShift[0] /= scaling[0];
	}
	if (scaling[1] != 0)
	{
		origShift[1] /= scaling[1];
	}
	if (scaling[2] != 0)
	{
		origShift[2] /= scaling[2];
	}
	Point32 shift((int32_t) origShift[medAxis], (int32_t) origShift[maxAxis], (int32_t) origShift[minAxis]);
	if (shift.isZero())
	{
		return true;
	}
	Point64 normal = face->getNormal();
#ifdef DEBUG_CONVEX_HULL
	printf("\nShrinking face (%d %d %d) (%d %d %d) (%d %d %d) by (%d %d %d)\n",
				 face->origin.x, face->origin.y, face->origin.z, face->dir0.x, face->dir0.y, face->dir0.z, face->dir1.x, face->dir1.y, face->dir1.z, shift.x, shift.y, shift.z);
#endif
	int64_t origDot = face->origin.dot(normal);
	Point32 shiftedOrigin = face->origin + shift;
	int64_t shiftedDot = shiftedOrigin.dot(normal);
	btAssert(shiftedDot <= origDot);
	if (shiftedDot >= origDot)
	{
		return false;
	}

	Edge* intersection = NULL;

	Edge* startEdge = face->nearbyVertex->edges;
#ifdef DEBUG_CONVEX_HULL
	printf("Start edge is ");
	startEdge->print();
	printf(", normal is (%lld %lld %lld), shifted dot is %lld\n", normal.x, normal.y, normal.z, shiftedDot);
#endif
	Rational128 optDot = face->nearbyVertex->dot(normal);
	int cmp = optDot.compare(shiftedDot);
#ifdef SHOW_ITERATIONS
	int n = 0;
#endif
	if (cmp >= 0)
	{
		Edge* e = startEdge;
		do
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			Rational128 dot = e->target->dot(normal);
			btAssert(dot.compare(origDot) <= 0);
#ifdef DEBUG_CONVEX_HULL
			printf("Moving downwards, edge is ");
			e->print();
			printf(", dot is %f (%f %lld)\n", (float) dot.toScalar(), (float) optDot.toScalar(), shiftedDot);
#endif
			if (dot.compare(optDot) < 0)
			{
				int c = dot.compare(shiftedDot);
				optDot = dot;
				e = e->reverse;
				startEdge = e;
				if (c < 0)
				{
					intersection = e;
					break;
				}
				cmp = c;
			}
			e = e->prev;
		} while (e != startEdge);

		if (!intersection)
		{
			return false;
		}
	}
	else
	{
		Edge* e = startEdge;
		do
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			Rational128 dot = e->target->dot(normal);
			btAssert(dot.compare(origDot) <= 0);
#ifdef DEBUG_CONVEX_HULL
			printf("Moving upwards, edge is ");
			e->print();
			printf(", dot is %f (%f %lld)\n", (float) dot.toScalar(), (float) optDot.toScalar(), shiftedDot);
#endif
			if (dot.compare(optDot) > 0)
			{
				cmp = dot.compare(shiftedDot);
				if (cmp >= 0)
				{
					intersection = e;
					break;
				}
				optDot = dot;
				e = e->reverse;
				startEdge = e;
			}
			e = e->prev;
		} while (e != startEdge);
		
		if (!intersection)
		{
			return true;
		}
	}

#ifdef SHOW_ITERATIONS
	printf("Needed %d iterations to find initial intersection\n", n);
#endif

	if (cmp == 0)
	{
		Edge* e = intersection->reverse->next;
#ifdef SHOW_ITERATIONS
		n = 0;
#endif
		while (e->target->dot(normal).compare(shiftedDot) <= 0)
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			e = e->next;
			if (e == intersection->reverse)
			{
				return true;
			}
#ifdef DEBUG_CONVEX_HULL
			printf("Checking for outwards edge, current edge is ");
			e->print();
			printf("\n");
#endif
		}
#ifdef SHOW_ITERATIONS
		printf("Needed %d iterations to check for complete containment\n", n);
#endif
	}
	
	Edge* firstIntersection = NULL;
	Edge* faceEdge = NULL;
	Edge* firstFaceEdge = NULL;

#ifdef SHOW_ITERATIONS
	int m = 0;
#endif
	while (true)
	{
#ifdef SHOW_ITERATIONS
		m++;
#endif
#ifdef DEBUG_CONVEX_HULL
		printf("Intersecting edge is ");
		intersection->print();
		printf("\n");
#endif
		if (cmp == 0)
		{
			Edge* e = intersection->reverse->next;
			startEdge = e;
#ifdef SHOW_ITERATIONS
			n = 0;
#endif
			while (true)
			{
#ifdef SHOW_ITERATIONS
				n++;
#endif
				if (e->target->dot(normal).compare(shiftedDot) >= 0)
				{
					break;
				}
				intersection = e->reverse;
				e = e->next;
				if (e == startEdge)
				{
					return true;
				}
			}
#ifdef SHOW_ITERATIONS
			printf("Needed %d iterations to advance intersection\n", n);
#endif
		}

#ifdef DEBUG_CONVEX_HULL
		printf("Advanced intersecting edge to ");
		intersection->print();
		printf(", cmp = %d\n", cmp);
#endif

		if (!firstIntersection)
		{
			firstIntersection = intersection;
		}
		else if (intersection == firstIntersection)
		{
			break;
		}

		int prevCmp = cmp;
		Edge* prevIntersection = intersection;
		Edge* prevFaceEdge = faceEdge;

		Edge* e = intersection->reverse;
#ifdef SHOW_ITERATIONS
		n = 0;
#endif
		while (true)
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			e = e->reverse->prev;
			btAssert(e != intersection->reverse);
			cmp = e->target->dot(normal).compare(shiftedDot);
#ifdef DEBUG_CONVEX_HULL
			printf("Testing edge ");
			e->print();
			printf(" -> cmp = %d\n", cmp);
#endif
			if (cmp >= 0)
			{
				intersection = e;
				break;
			}
		}
#ifdef SHOW_ITERATIONS
		printf("Needed %d iterations to find other intersection of face\n", n);
#endif

		if (cmp > 0)
		{
			Vertex* removed = intersection->target;
			e = intersection->reverse;
			if (e->prev == e)
			{
				removed->edges = NULL;
			}
			else
			{
				removed->edges = e->prev;
				e->prev->link(e->next);
				e->link(e);
			}
#ifdef DEBUG_CONVEX_HULL
			printf("1: Removed part contains (%d %d %d)\n", removed->point.x, removed->point.y, removed->point.z);
#endif
			
			Point64 n0 = intersection->face->getNormal();
			Point64 n1 = intersection->reverse->face->getNormal();
			int64_t m00 = face->dir0.dot(n0);
			int64_t m01 = face->dir1.dot(n0);
			int64_t m10 = face->dir0.dot(n1);
			int64_t m11 = face->dir1.dot(n1);
			int64_t r0 = (intersection->face->origin - shiftedOrigin).dot(n0);
			int64_t r1 = (intersection->reverse->face->origin - shiftedOrigin).dot(n1);
			Int128 det = Int128::mul(m00, m11) - Int128::mul(m01, m10);
			btAssert(det.getSign() != 0);
			Vertex* v = vertexPool.newObject();
			v->point.index = -1;
			v->copy = -1;
			v->point128 = PointR128(Int128::mul(face->dir0.x * r0, m11) - Int128::mul(face->dir0.x * r1, m01)
															+ Int128::mul(face->dir1.x * r1, m00) - Int128::mul(face->dir1.x * r0, m10) + det * shiftedOrigin.x,
															Int128::mul(face->dir0.y * r0, m11) - Int128::mul(face->dir0.y * r1, m01)
															+ Int128::mul(face->dir1.y * r1, m00) - Int128::mul(face->dir1.y * r0, m10) + det * shiftedOrigin.y,
															Int128::mul(face->dir0.z * r0, m11) - Int128::mul(face->dir0.z * r1, m01)
															+ Int128::mul(face->dir1.z * r1, m00) - Int128::mul(face->dir1.z * r0, m10) + det * shiftedOrigin.z,
															det);
			v->point.x = (int32_t) v->point128.xvalue();
			v->point.y = (int32_t) v->point128.yvalue();
			v->point.z = (int32_t) v->point128.zvalue();
			intersection->target = v;
			v->edges = e;

			stack.push_back(v);
			stack.push_back(removed);
			stack.push_back(NULL);
		}

		if (cmp || prevCmp || (prevIntersection->reverse->next->target != intersection->target))
		{
			faceEdge = newEdgePair(prevIntersection->target, intersection->target);
			if (prevCmp == 0)
			{
				faceEdge->link(prevIntersection->reverse->next);
			}
			if ((prevCmp == 0) || prevFaceEdge)
			{
				prevIntersection->reverse->link(faceEdge);
			}
			if (cmp == 0)
			{
				intersection->reverse->prev->link(faceEdge->reverse);
			}
			faceEdge->reverse->link(intersection->reverse);
		}
		else
		{
			faceEdge = prevIntersection->reverse->next;
		}

		if (prevFaceEdge)
		{
			if (prevCmp > 0)
			{
				faceEdge->link(prevFaceEdge->reverse);
			}
			else if (faceEdge != prevFaceEdge->reverse)
			{
				stack.push_back(prevFaceEdge->target);
				while (faceEdge->next != prevFaceEdge->reverse)
				{
					Vertex* removed = faceEdge->next->target;
					removeEdgePair(faceEdge->next);
					stack.push_back(removed);
#ifdef DEBUG_CONVEX_HULL
					printf("2: Removed part contains (%d %d %d)\n", removed->point.x, removed->point.y, removed->point.z);
#endif
				}
				stack.push_back(NULL);
			}
		}
		faceEdge->face = face;
		faceEdge->reverse->face = intersection->face;

		if (!firstFaceEdge)
		{
			firstFaceEdge = faceEdge;
		}
	}
#ifdef SHOW_ITERATIONS
	printf("Needed %d iterations to process all intersections\n", m);
#endif

	if (cmp > 0)
	{
		firstFaceEdge->reverse->target = faceEdge->target;
		firstIntersection->reverse->link(firstFaceEdge);
		firstFaceEdge->link(faceEdge->reverse);
	}
	else if (firstFaceEdge != faceEdge->reverse)
	{
		stack.push_back(faceEdge->target);
		while (firstFaceEdge->next != faceEdge->reverse)
		{
			Vertex* removed = firstFaceEdge->next->target;
			removeEdgePair(firstFaceEdge->next);
			stack.push_back(removed);
#ifdef DEBUG_CONVEX_HULL
			printf("3: Removed part contains (%d %d %d)\n", removed->point.x, removed->point.y, removed->point.z);
#endif
		}
		stack.push_back(NULL);
	}

	btAssert(stack.size() > 0);
	vertexList = stack[0];

#ifdef DEBUG_CONVEX_HULL
	printf("Removing part\n");
#endif
#ifdef SHOW_ITERATIONS
	n = 0;
#endif
	int pos = 0;
	while (pos < stack.size())
	{
		int end = stack.size();
		while (pos < end)
		{
			Vertex* kept = stack[pos++];
#ifdef DEBUG_CONVEX_HULL
			kept->print();
#endif
			bool deeper = false;
			Vertex* removed;
			while ((removed = stack[pos++]) != NULL)
			{
#ifdef SHOW_ITERATIONS
				n++;
#endif
				kept->receiveNearbyFaces(removed);
				while (removed->edges)
				{
					if (!deeper)
					{
						deeper = true;
						stack.push_back(kept);
					}
					stack.push_back(removed->edges->target);
					removeEdgePair(removed->edges);
				}
			}
			if (deeper)
			{
				stack.push_back(NULL);
			}
		}
	}
#ifdef SHOW_ITERATIONS
	printf("Needed %d iterations to remove part\n", n);
#endif

	stack.resize(0);
	face->origin = shiftedOrigin;

	return true;
}